

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O1

int gdGetInt(int *result,gdIOCtx *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (*ctx->getC)(ctx);
  iVar2 = 0;
  iVar3 = 0;
  if (iVar1 != -1) {
    *result = iVar1 << 0x18;
    iVar1 = (*ctx->getC)(ctx);
    iVar3 = iVar2;
    if (iVar1 != -1) {
      *result = *result + iVar1 * 0x10000;
      iVar1 = (*ctx->getC)(ctx);
      if (iVar1 != -1) {
        *result = *result + iVar1 * 0x100;
        iVar1 = (*ctx->getC)(ctx);
        if (iVar1 != -1) {
          *result = *result + iVar1;
          iVar3 = 1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int gdGetInt(int *result, gdIOCtx *ctx)
{
	int r;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result = r << 24;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result += r << 16;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result += r << 8;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result += r;

	return 1;
}